

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O1

int __thiscall
IDisk::AddByteToSpecificTrack(IDisk *this,int side,uint track,uint index,uchar byte,int size)

{
  MFMTrack *pMVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  uchar *puVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  uchar buffer [16];
  char local_38 [16];
  
  pMVar1 = this->side_[side].tracks;
  uVar4 = pMVar1[track].size;
  if (uVar4 <= size + index) {
    uVar4 = uVar4 - index;
    if ((int)uVar4 < 1) {
      iVar2 = 0;
    }
    else {
      if (index == 0) {
        iVar2 = 7;
        pcVar6 = local_38 + 1;
        bVar9 = false;
        do {
          bVar10 = !bVar9;
          bVar11 = (1 << ((byte)iVar2 & 0x1f) & (uint)byte) == 0;
          bVar9 = !bVar11;
          *pcVar6 = !bVar11;
          pcVar6[-1] = bVar11 && bVar10;
          pcVar6 = pcVar6 + 2;
          bVar10 = iVar2 != 0;
          iVar2 = iVar2 + -1;
        } while (bVar10);
      }
      else {
        puVar7 = pMVar1[track].bitfield + (index - 1);
        uVar3 = 0;
        uVar5 = 7;
        pcVar6 = local_38 + 1;
        do {
          bVar9 = (byte >> (uVar5 & 0x1f) & 1) == 0;
          if (bVar9) {
            bVar10 = *puVar7 == '\0';
          }
          else {
            bVar10 = false;
          }
          pcVar6[-1] = bVar10;
          *pcVar6 = !bVar9;
          uVar8 = (ulong)uVar3;
          uVar3 = uVar3 + 2;
          puVar7 = (uchar *)(local_38 + uVar8 + 1);
          pcVar6 = pcVar6 + 2;
          bVar9 = uVar5 != 0;
          uVar5 = uVar5 - 1;
        } while (bVar9);
      }
      memcpy(pMVar1[track].bitfield + index,local_38,(ulong)uVar4);
      iVar2 = size - uVar4;
      memcpy(this->side_[side].tracks[track].bitfield,local_38 + uVar4,(long)iVar2);
    }
    return iVar2;
  }
  iVar2 = AddByteToTrackInBits(pMVar1[track].bitfield,index,byte,size,uVar4);
  return iVar2;
}

Assistant:

int IDisk::AddByteToSpecificTrack(int side, unsigned int track, unsigned int index, unsigned char byte, int size)
{
   if (index + size >= side_[side].tracks[track].size)
   {
      unsigned char buffer[16];

      const int nb_byte_to_last_track = side_[side].tracks[track].size - index;

      if (nb_byte_to_last_track > 0)
      {
         // Index should be far more than 0 ! Otherwiser, track is about 16 bit long ??
         if (index > 0)
         {
            AddByteToTrack(buffer, 0, byte, 8, side_[side].tracks[track].bitfield[index - 1]);
         }
         else
         {
            AddByteToTrack(buffer, 0, byte, 8, 0);
         }
         memcpy(&side_[side].tracks[track].bitfield[index], buffer, nb_byte_to_last_track);

         // Copy remaining to begining of the track ?
         memcpy(&side_[side].tracks[track].bitfield[0], &buffer[nb_byte_to_last_track], size - nb_byte_to_last_track);
         return (size) - nb_byte_to_last_track;
      }
      // TODO !
      return 0;
   }
   return AddByteToTrackInBits(side_[side].tracks[track].bitfield, index, byte, size, side_[side].tracks[track].size);
}